

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O0

TestStatus *
vkt::image::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  pointer *this;
  VkFormat format;
  VkDescriptorPool descriptorPool_00;
  VkPipelineLayout VVar1;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)14>_> data_06;
  RefData<vk::Handle<(vk::HandleType)18>_> data_07;
  int iVar4;
  undefined8 uVar5;
  deUint32 dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  InstanceInterface *vki_00;
  VkPhysicalDevice physDevice_00;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Image *pIVar11;
  VkDeviceSize VVar12;
  Buffer *pBVar13;
  Allocation *pAVar14;
  void *pvVar15;
  void *ptr;
  VkDeviceMemory memory;
  VkDeviceSize VVar16;
  VkDeviceSize offset;
  DescriptorSetLayoutBuilder *pDVar17;
  DescriptorPoolBuilder *pDVar18;
  Handle<(vk::HandleType)21> *pHVar19;
  Handle<(vk::HandleType)19> *pHVar20;
  VkImage *pVVar21;
  Handle<(vk::HandleType)24> *pHVar22;
  ProgramCollection<vk::ProgramBinary> *pPVar23;
  ProgramBinary *pPVar24;
  Handle<(vk::HandleType)16> *pHVar25;
  Handle<(vk::HandleType)14> *pHVar26;
  VkCommandBuffer_s **ppVVar27;
  Handle<(vk::HandleType)18> *pHVar28;
  reference pvVar29;
  RefBase<vk::Handle<(vk::HandleType)22>_> *pRVar30;
  Handle<(vk::HandleType)22> *pHVar31;
  reference pvVar32;
  RefBase<vk::Handle<(vk::HandleType)13>_> *pRVar33;
  Handle<(vk::HandleType)13> *pHVar34;
  VkBuffer *pVVar35;
  DescriptorSetUpdateBuilder *pDVar36;
  TestContext *this_00;
  TestLog *pTVar37;
  MessageBuilder *pMVar38;
  deUint32 arraySize;
  VkExtent3D extent;
  deUint32 local_10bc;
  allocator<char> local_f01;
  string local_f00;
  undefined4 local_ee0;
  allocator<char> local_ed9;
  string local_ed8;
  MessageBuilder local_eb8;
  MessageBuilder local_d38;
  int local_bb8;
  int local_bb4;
  int x;
  int y;
  int layer;
  deInt32 expectedChecksum;
  deInt32 *pDataPtr;
  IVec3 imageSize;
  Allocation *alloc_2;
  undefined1 local_b78 [8];
  VkBufferMemoryBarrier barriers_3 [1];
  undefined1 local_b0c [12];
  VkExtent3D local_b00;
  undefined1 local_af0 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_a98 [8];
  VkImageMemoryBarrier barriers_2 [1];
  Location local_a40;
  VkDescriptorSet local_a38;
  Location local_a30;
  VkDescriptorSet local_a28;
  Location local_a20;
  VkDescriptorSet local_a18;
  DescriptorSetUpdateBuilder local_a10;
  deUint64 local_9c8;
  undefined1 local_9c0 [8];
  VkDescriptorBufferInfo descriptorConstantsBufferInfo_1;
  VkSampler local_9a0;
  undefined1 local_998 [8];
  VkDescriptorImageInfo descriptorChecksumImageInfo;
  VkSampler local_978;
  undefined1 local_970 [8];
  VkDescriptorImageInfo descriptorMultiImageInfo_1;
  VkDescriptorSet descriptorSet_1;
  int layerNdx_2;
  undefined1 local_928 [8];
  VkImageMemoryBarrier barriers_1 [1];
  Move<vk::Handle<(vk::HandleType)18>_> local_8c8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_8a8;
  undefined1 local_888 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline_1;
  string local_860;
  Move<vk::Handle<(vk::HandleType)14>_> local_840;
  RefData<vk::Handle<(vk::HandleType)14>_> local_820;
  undefined1 local_800 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule_1;
  Location local_7d8;
  VkDescriptorSet local_7d0;
  Location local_7c8;
  VkDescriptorSet local_7c0;
  DescriptorSetUpdateBuilder local_7b8;
  deUint64 local_770;
  undefined1 local_768 [8];
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  VkSampler local_748;
  undefined1 local_740 [8];
  VkDescriptorImageInfo descriptorMultiImageInfo;
  VkDescriptorSet descriptorSet;
  int layerNdx_1;
  undefined1 local_6d8 [8];
  VkImageMemoryBarrier barriers [2];
  Move<vk::Handle<(vk::HandleType)18>_> local_630;
  RefData<vk::Handle<(vk::HandleType)18>_> local_610;
  undefined1 local_5f0 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_5c8;
  Move<vk::Handle<(vk::HandleType)14>_> local_5a8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_588;
  undefined1 local_568 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  deUint32 dStack_540;
  VkImageSubresourceRange subresourceAllLayers;
  int loopNumLayers;
  IVec3 workSize;
  Move<vk::VkCommandBuffer_s_*> local_518;
  RefData<vk::VkCommandBuffer_s_*> local_4f8;
  undefined1 local_4d8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_498;
  undefined1 local_478 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_450;
  RefData<vk::Handle<(vk::HandleType)16>_> local_430;
  undefined1 local_410 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  undefined1 local_3d0 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allChecksumImageViews;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allMultisampledImageViews;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  allDescriptorSets;
  Move<vk::Handle<(vk::HandleType)21>_> local_370;
  RefData<vk::Handle<(vk::HandleType)21>_> local_350;
  undefined1 local_330 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_2c8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2a8;
  undefined1 local_288 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Allocation *alloc_1;
  VkBufferCreateInfo local_250;
  undefined1 local_218 [8];
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  deInt32 *valuePtr;
  int layerNdx;
  deUint8 *basePtr;
  Allocation *alloc;
  VkBufferCreateInfo local_1c0;
  undefined1 local_188 [8];
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> constantsBuffer;
  VkDeviceSize constantsBufferSizeBytes;
  VkDeviceSize bufferChunkSize;
  DefaultDeleter<vkt::image::Image> local_15d;
  int numLayers;
  Texture local_158;
  VkImageCreateInfo local_140;
  undefined1 local_e8 [8];
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> checksumImage;
  VkImageCreateInfo local_c0;
  undefined1 local_68 [8];
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> msImage;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  CaseDef *caseDef_local;
  Context *context_local;
  
  vki_00 = Context::getInstanceInterface(context);
  physDevice_00 = Context::getPhysicalDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data._8_8_ =
       Context::getDefaultAllocator(context);
  checkRequirements(vki_00,physDevice_00,caseDef);
  pIVar11 = (Image *)operator_new(0x30);
  uVar5 = msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data
          ._8_8_;
  makeImageCreateInfo(&local_c0,&caseDef->texture,caseDef->format,8,0);
  image::Image::Image(pIVar11,vk_00,device_00,(Allocator *)uVar5,&local_c0,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Image> *)
             &checksumImage.
              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
              field_0xf);
  de::details::UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::UniquePtr
            ((UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_68,
             pIVar11);
  pIVar11 = (Image *)operator_new(0x30);
  uVar5 = msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data
          ._8_8_;
  Texture::Texture(&local_158,&caseDef->texture,1);
  makeImageCreateInfo(&local_140,&local_158,VK_FORMAT_R32_SINT,9,0);
  numLayers = ::vk::MemoryRequirement::Any.m_flags;
  image::Image::Image(pIVar11,vk_00,device_00,(Allocator *)uVar5,&local_140,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter(&local_15d);
  de::details::UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::UniquePtr
            ((UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_e8,
             pIVar11);
  local_10bc = Texture::numLayers(&caseDef->texture);
  VVar12 = getOptimalUniformBufferChunkSize(vki_00,physDevice_00,4);
  constantsBuffer.super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
  m_data._8_8_ = (long)(int)local_10bc * VVar12;
  pBVar13 = (Buffer *)operator_new(0x30);
  uVar5 = msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data
          ._8_8_;
  makeBufferCreateInfo
            (&local_1c0,
             constantsBuffer.
             super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
             _8_8_,0x10);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (pBVar13,vk_00,device_00,(Allocator *)uVar5,&local_1c0,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Buffer> *)((long)&alloc + 3));
  de::details::UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::UniquePtr
            ((UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)local_188);
  pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                       local_188);
  pAVar14 = image::Buffer::getAllocation(pBVar13);
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar14);
  ptr = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemset(ptr,0,constantsBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data._8_8_);
  for (valuePtr._4_4_ = 0; valuePtr._4_4_ < (int)local_10bc; valuePtr._4_4_ = valuePtr._4_4_ + 1) {
    *(int *)((long)pvVar15 + (long)valuePtr._4_4_ * VVar12) = valuePtr._4_4_;
  }
  memory = ::vk::Allocation::getMemory(pAVar14);
  VVar16 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,memory,VVar16,
             constantsBuffer.
             super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
             _8_8_);
  Texture::size((Texture *)
                &resultBuffer.
                 super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                 m_data.field_0xc);
  VVar16 = getImageSizeBytes((IVec3 *)&resultBuffer.
                                       super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                                       .m_data.field_0xc,VK_FORMAT_R32_SINT);
  pBVar13 = (Buffer *)operator_new(0x30);
  uVar5 = msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data
          ._8_8_;
  makeBufferCreateInfo(&local_250,VVar16,2);
  alloc_1._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (pBVar13,vk_00,device_00,(Allocator *)uVar5,&local_250,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Buffer> *)((long)&alloc_1 + 3));
  de::details::UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::UniquePtr
            ((UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)local_218);
  pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                       local_218);
  pAVar14 = image::Buffer::getAllocation(pBVar13);
  pvVar15 = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemset(pvVar15,0,VVar16);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar14);
  offset = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
             m_allocator,offset,VVar16);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_2c8,pDVar17,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a8,(Move *)&local_2c8);
  data.deleter.m_deviceIface._0_4_ = (int)local_2a8.deleter.m_deviceIface;
  data.object.m_internal = local_2a8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2a8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_2a8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_2a8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_2a8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_2a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_288,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_2c8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &allDescriptorSets.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pDVar18 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &allDescriptorSets.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_10bc);
  pDVar18 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar18,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,local_10bc);
  pDVar18 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar18,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,local_10bc);
  ::vk::DescriptorPoolBuilder::build(&local_370,pDVar18,vk_00,device_00,1,local_10bc);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_350,(Move *)&local_370);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_350.deleter.m_deviceIface;
  data_00.object.m_internal = local_350.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_350.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_350.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_350.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_350.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_350.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_330,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_370);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &allDescriptorSets.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this = &allMultisampledImageViews.
          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
            *)this);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)&allChecksumImageViews.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)local_3d0);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_330);
  descriptorPool_00.m_internal = pHVar19->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_288);
  insertDescriptorSets
            (vk_00,device_00,caseDef,descriptorPool_00,(VkDescriptorSetLayout)pHVar20->m_internal,
             (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)this);
  format = caseDef->format;
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_68);
  pVVar21 = image::Image::operator*(pIVar11);
  insertImageViews(vk_00,device_00,caseDef,format,(VkImage)pVVar21->m_internal,
                   (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    *)&allChecksumImageViews.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_e8);
  pVVar21 = image::Image::operator*(pIVar11);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVVar21->m_internal;
  insertImageViews(vk_00,device_00,caseDef,VK_FORMAT_R32_SINT,
                   (VkImage)pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                            deleter.m_allocator,
                   (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    *)local_3d0);
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_288);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar20->m_internal;
  makePipelineLayout(&local_450,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_430,(Move *)&local_450);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_430.deleter.m_deviceIface;
  data_01.object.m_internal = local_430.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_430.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_430.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_430.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_430.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_430.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_410,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_450);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,dVar6,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_498,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_02.object.m_internal = local_498.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_498.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_498.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_498.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_498.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_478,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_478);
  ::vk::allocateCommandBuffer
            (&local_518,vk_00,device_00,(VkCommandPool)pHVar22->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4f8,(Move *)&local_518);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_4f8.deleter.m_deviceIface;
  data_03.object = local_4f8.object;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_4f8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_4f8.deleter.m_device >> 0x20);
  data_03.deleter.m_pool.m_internal._0_4_ = (int)local_4f8.deleter.m_pool.m_internal;
  data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_4f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_4d8,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_518);
  if ((caseDef->singleLayerBind & 1U) == 0) {
    Texture::size((Texture *)&subresourceAllLayers.layerCount);
  }
  else {
    Texture::layerSize((Texture *)&subresourceAllLayers.layerCount);
  }
  if ((caseDef->singleLayerBind & 1U) == 0) {
    local_10bc = 1;
  }
  subresourceAllLayers.baseArrayLayer = local_10bc;
  dVar6 = Texture::numLayers(&caseDef->texture);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             ((long)&shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 4),1,0,1,0,dVar6);
  pPVar23 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"comp_store",
             (allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar23,&local_5c8);
  ::vk::createShaderModule(&local_5a8,vk_00,device_00,pPVar24,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_588,(Move *)&local_5a8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_588.deleter.m_deviceIface;
  data_04.object.m_internal = local_588.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_588.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_588.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_588.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_588.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_588.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_568,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_410);
  VVar1.m_internal = pHVar25->m_internal;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_568);
  makeComputePipeline(&local_630,vk_00,device_00,VVar1,(VkShaderModule)pHVar26->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_610,(Move *)&local_630);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_610.deleter.m_deviceIface;
  data_05.object.m_internal = local_610.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_610.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_610.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_610.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_610.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_610.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5f0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_630);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  beginCommandBuffer(vk_00,*ppVVar27);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar2 = *ppVVar27;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5f0);
  barriers[1]._64_8_ = pHVar28->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,barriers[1]._64_8_);
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_68);
  pVVar21 = image::Image::operator*(pIVar11);
  subresourceRange.levelCount = subresourceAllLayers.aspectMask;
  subresourceRange.aspectMask =
       shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_;
  subresourceRange.baseMipLevel = dStack_540;
  subresourceRange.baseArrayLayer = subresourceAllLayers.baseMipLevel;
  subresourceRange.layerCount = subresourceAllLayers.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_6d8,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar21->m_internal,subresourceRange);
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_e8);
  pVVar21 = image::Image::operator*(pIVar11);
  subresourceRange_00.levelCount = subresourceAllLayers.aspectMask;
  subresourceRange_00.aspectMask =
       shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_;
  subresourceRange_00.baseMipLevel = dStack_540;
  subresourceRange_00.baseArrayLayer = subresourceAllLayers.baseMipLevel;
  subresourceRange_00.layerCount = subresourceAllLayers.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&barriers[0].subresourceRange.layerCount,0,0x40,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar21->m_internal,
             subresourceRange_00);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar27,1,0x800,0,0,0,0,0,2,local_6d8);
  for (descriptorSet.m_internal._4_4_ = 0;
      descriptorSet.m_internal._4_4_ < (int)subresourceAllLayers.baseArrayLayer;
      descriptorSet.m_internal._4_4_ = descriptorSet.m_internal._4_4_ + 1) {
    pvVar29 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)&allMultisampledImageViews.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)descriptorSet.m_internal._4_4_);
    pRVar30 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                         (pvVar29)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
    pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(pRVar30);
    descriptorMultiImageInfo._16_8_ = pHVar31->m_internal;
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_748,0);
    pvVar32 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            *)&allChecksumImageViews.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)descriptorSet.m_internal._4_4_);
    pRVar33 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar32)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar33);
    descriptorConstantsBufferInfo.range = pHVar34->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_740,local_748,
               (VkImageView)descriptorConstantsBufferInfo.range,VK_IMAGE_LAYOUT_GENERAL);
    pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
              operator->((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                         local_188);
    pVVar35 = image::Buffer::get(pBVar13);
    local_770 = pVVar35->m_internal;
    ::vk::makeDescriptorBufferInfo
              ((VkDescriptorBufferInfo *)local_768,(VkBuffer)local_770,
               (long)descriptorSet.m_internal._4_4_ * VVar12,VVar12);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_7b8);
    local_7c0.m_internal = descriptorMultiImageInfo._16_8_;
    local_7c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar36 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_7b8,local_7c0,&local_7c8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                         (VkDescriptorBufferInfo *)local_768);
    local_7d0.m_internal = descriptorMultiImageInfo._16_8_;
    local_7d8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    pDVar36 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (pDVar36,local_7d0,&local_7d8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                         (VkDescriptorImageInfo *)local_740);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar36,vk_00,device_00);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_7b8);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
    pVVar2 = *ppVVar27;
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_410);
    shaderModule_1.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar25->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x56])
              (vk_00,pVVar2,1,
               shaderModule_1.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
               m_allocator,0,1,&descriptorMultiImageInfo.imageLayout,0,0);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
    pVVar2 = *ppVVar27;
    uVar7 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    uVar8 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    tcu::Vector<int,_3>::z((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar7,(ulong)uVar8);
  }
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  endCommandBuffer(vk_00,*ppVVar27);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar27);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_568);
  pPVar23 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"comp_load",
             (allocator<char> *)
             ((long)&pipeline_1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar24 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar23,&local_860);
  ::vk::createShaderModule(&local_840,vk_00,device_00,pPVar24,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_820,(Move *)&local_840);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_820.deleter.m_deviceIface;
  data_06.object.m_internal = local_820.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_820.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_820.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_820.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_820.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_820.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_800,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_840);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipeline_1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_410);
  VVar1.m_internal = pHVar25->m_internal;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_800);
  makeComputePipeline(&local_8c8,vk_00,device_00,VVar1,(VkShaderModule)pHVar26->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_8a8,(Move *)&local_8c8);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_8a8.deleter.m_deviceIface;
  data_07.object.m_internal = local_8a8.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8a8.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_8a8.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_8a8.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_8a8.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_8a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_888,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_8c8);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  beginCommandBuffer(vk_00,*ppVVar27);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar2 = *ppVVar27;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_888);
  barriers_1[0]._64_8_ = pHVar28->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,barriers_1[0]._64_8_);
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_68);
  pVVar21 = image::Image::operator*(pIVar11);
  subresourceRange_01.levelCount = subresourceAllLayers.aspectMask;
  subresourceRange_01.aspectMask =
       shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_;
  subresourceRange_01.baseMipLevel = dStack_540;
  subresourceRange_01.baseArrayLayer = subresourceAllLayers.baseMipLevel;
  subresourceRange_01.layerCount = subresourceAllLayers.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_928,0x40,0x20,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL,(VkImage)pVVar21->m_internal,subresourceRange_01);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar27,0x800,0x800,0,0,0,0,0,1,local_928);
  for (descriptorSet_1.m_internal._4_4_ = 0;
      descriptorSet_1.m_internal._4_4_ < (int)subresourceAllLayers.baseArrayLayer;
      descriptorSet_1.m_internal._4_4_ = descriptorSet_1.m_internal._4_4_ + 1) {
    pvVar29 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            *)&allMultisampledImageViews.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)descriptorSet_1.m_internal._4_4_);
    pRVar30 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                         (pvVar29)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
    pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(pRVar30);
    descriptorMultiImageInfo_1._16_8_ = pHVar31->m_internal;
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_978,0);
    pvVar32 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            *)&allChecksumImageViews.
                               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)descriptorSet_1.m_internal._4_4_);
    pRVar33 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar32)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar33);
    descriptorChecksumImageInfo._16_8_ = pHVar34->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_970,local_978,
               (VkImageView)descriptorChecksumImageInfo._16_8_,VK_IMAGE_LAYOUT_GENERAL);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_9a0,0);
    pvVar32 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                            *)local_3d0,(long)descriptorSet_1.m_internal._4_4_);
    pRVar33 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar32)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar33);
    descriptorConstantsBufferInfo_1.range = pHVar34->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_998,local_9a0,
               (VkImageView)descriptorConstantsBufferInfo_1.range,VK_IMAGE_LAYOUT_GENERAL);
    pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
              operator->((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                         local_188);
    pVVar35 = image::Buffer::get(pBVar13);
    local_9c8 = pVVar35->m_internal;
    ::vk::makeDescriptorBufferInfo
              ((VkDescriptorBufferInfo *)local_9c0,(VkBuffer)local_9c8,
               (long)descriptorSet_1.m_internal._4_4_ * VVar12,VVar12);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_a10);
    local_a18.m_internal = descriptorMultiImageInfo_1._16_8_;
    local_a20 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    pDVar36 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (&local_a10,local_a18,&local_a20,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                         (VkDescriptorBufferInfo *)local_9c0);
    local_a28.m_internal = descriptorMultiImageInfo_1._16_8_;
    local_a30 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    pDVar36 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (pDVar36,local_a28,&local_a30,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                         (VkDescriptorImageInfo *)local_970);
    local_a38.m_internal = descriptorMultiImageInfo_1._16_8_;
    local_a40 = ::vk::DescriptorSetUpdateBuilder::Location::binding(2);
    pDVar36 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                        (pDVar36,local_a38,&local_a40,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                         (VkDescriptorImageInfo *)local_998);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar36,vk_00,device_00);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_a10);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
    pVVar2 = *ppVVar27;
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_410);
    (*vk_00->_vptr_DeviceInterface[0x56])
              (vk_00,pVVar2,1,pHVar25->m_internal,0,1,&descriptorMultiImageInfo_1.imageLayout,0,0);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
    pVVar2 = *ppVVar27;
    uVar7 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    uVar8 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    uVar9 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&subresourceAllLayers.layerCount);
    (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar7,(ulong)uVar8,(ulong)uVar9);
  }
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  endCommandBuffer(vk_00,*ppVVar27);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar27);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_888);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_800);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  beginCommandBuffer(vk_00,*ppVVar27);
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_e8);
  pVVar21 = image::Image::operator*(pIVar11);
  copyRegion.imageExtent.height =
       shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_;
  copyRegion.imageExtent.depth = dStack_540;
  subresourceRange_02.levelCount = subresourceAllLayers.aspectMask;
  subresourceRange_02.aspectMask =
       shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_;
  subresourceRange_02.baseMipLevel = dStack_540;
  subresourceRange_02.baseArrayLayer = subresourceAllLayers.baseMipLevel;
  subresourceRange_02.layerCount = subresourceAllLayers.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_a98,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar21->m_internal,subresourceRange_02);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  arraySize = 0;
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar27,0x800,0x1000,0,0,0,0,0,1,local_a98);
  Texture::layerSize((Texture *)local_b0c);
  local_b00 = ::vk::makeExtent3D((IVec3 *)local_b0c);
  dVar6 = Texture::numLayers(&caseDef->texture);
  extent.height = 0;
  extent.width = local_b00.depth;
  extent.depth = dVar6;
  makeBufferImageCopy((VkBufferImageCopy *)local_af0,(image *)local_b00._0_8_,extent,arraySize);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar2 = *ppVVar27;
  pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
            operator*((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
                      local_e8);
  pVVar21 = image::Image::operator*(pIVar11);
  dVar3 = pVVar21->m_internal;
  pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator*((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                      local_218);
  pVVar35 = image::Buffer::operator*(pBVar13);
  barriers_3[0].size = pVVar35->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,dVar3,6,barriers_3[0].size,1,local_af0);
  pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator*((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                      local_218);
  pVVar35 = image::Buffer::operator*(pBVar13);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_b78,0x1000,0x2000,(VkBuffer)pVVar35->m_internal,0,VVar16
            );
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar27,0x1000,0x4000,0,0,0,1,(int)local_b78,0,0);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  endCommandBuffer(vk_00,*ppVVar27);
  ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar27);
  pBVar13 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
                       local_218);
  pAVar14 = image::Buffer::getAllocation(pBVar13);
  imageSize.m_data._4_8_ = ::vk::Allocation::getMemory(pAVar14);
  VVar12 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)imageSize.m_data._4_8_,VVar12,VVar16);
  Texture::size((Texture *)((long)&pDataPtr + 4));
  _layer = (int *)::vk::Allocation::getHostPtr(pAVar14);
  y = Texture::numSamples(&caseDef->texture);
  x = 0;
  do {
    iVar4 = x;
    iVar10 = tcu::Vector<int,_3>::z((Vector<int,_3> *)((long)&pDataPtr + 4));
    if (iVar10 <= iVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"OK",&local_f01);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_f00);
      std::__cxx11::string::~string((string *)&local_f00);
      std::allocator<char>::~allocator(&local_f01);
LAB_00d27642:
      local_ee0 = 1;
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_4d8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_478);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_410);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 *)local_3d0);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 *)&allChecksumImageViews.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 *)&allMultisampledImageViews.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_330);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_288);
      de::details::UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
      ~UniquePtr((UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)local_218
                );
      de::details::UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
      ~UniquePtr((UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)local_188
                );
      de::details::UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniquePtr
                ((UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_e8);
      de::details::UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~UniquePtr
                ((UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_68);
      return __return_storage_ptr__;
    }
    local_bb4 = 0;
    while( true ) {
      iVar4 = local_bb4;
      iVar10 = tcu::Vector<int,_3>::y((Vector<int,_3> *)((long)&pDataPtr + 4));
      if (iVar10 <= iVar4) break;
      local_bb8 = 0;
      while( true ) {
        iVar4 = local_bb8;
        iVar10 = tcu::Vector<int,_3>::x((Vector<int,_3> *)((long)&pDataPtr + 4));
        if (iVar10 <= iVar4) break;
        if (*_layer != y) {
          this_00 = Context::getTestContext(context);
          pTVar37 = tcu::TestContext::getLog(this_00);
          tcu::TestLog::operator<<(&local_eb8,pTVar37,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar38 = tcu::MessageBuilder::operator<<
                              (&local_eb8,
                               (char (*) [55])
                               "Some sample colors were incorrect at (x, y, layer) = (");
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,&local_bb8);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,(char (*) [3])0x132ea91);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,&local_bb4);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,(char (*) [3])0x132ea91);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,&x);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,(char (*) [2])0x12d99d9);
          pTVar37 = tcu::MessageBuilder::operator<<
                              (pMVar38,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_d38,pTVar37,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar38 = tcu::MessageBuilder::operator<<(&local_d38,(char (*) [19])"Checksum value is ");
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,_layer);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,(char (*) [15])0x133dcd9);
          pMVar38 = tcu::MessageBuilder::operator<<(pMVar38,&y);
          tcu::MessageBuilder::operator<<(pMVar38,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_d38);
          tcu::MessageBuilder::~MessageBuilder(&local_eb8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ed8,"Some sample colors were incorrect",&local_ed9);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_ed8);
          std::__cxx11::string::~string((string *)&local_ed8);
          std::allocator<char>::~allocator(&local_ed9);
          goto LAB_00d27642;
        }
        _layer = _layer + 1;
        local_bb8 = local_bb8 + 1;
      }
      local_bb4 = local_bb4 + 1;
    }
    x = x + 1;
  } while( true );
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				device				= context.getDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkRequirements(vki, physDevice, caseDef);

	// Images

	const UniquePtr<Image> msImage(new Image(
		vk, device, allocator, makeImageCreateInfo(caseDef.texture, caseDef.format, VK_IMAGE_USAGE_STORAGE_BIT, 0u), MemoryRequirement::Any));

	const UniquePtr<Image> checksumImage(new Image(
		vk, device, allocator,
		makeImageCreateInfo(Texture(caseDef.texture, 1), CHECKSUM_IMAGE_FORMAT, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 0u),
		MemoryRequirement::Any));

	// Buffer used to pass constants to the shader.

	const int			numLayers					= caseDef.texture.numLayers();
	const VkDeviceSize	bufferChunkSize				= getOptimalUniformBufferChunkSize(vki, physDevice, sizeof(deInt32));
	const VkDeviceSize	constantsBufferSizeBytes	= numLayers * bufferChunkSize;
	UniquePtr<Buffer>	constantsBuffer				(new Buffer(vk, device, allocator, makeBufferCreateInfo(constantsBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT),
													 MemoryRequirement::HostVisible));

	{
		const Allocation&	alloc	= constantsBuffer->getAllocation();
		deUint8* const		basePtr = static_cast<deUint8*>(alloc.getHostPtr());

		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(constantsBufferSizeBytes));

		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			deInt32* const valuePtr = reinterpret_cast<deInt32*>(basePtr + layerNdx * bufferChunkSize);
			*valuePtr = layerNdx;
		}

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), constantsBufferSizeBytes);
	}

	const VkDeviceSize	resultBufferSizeBytes	= getImageSizeBytes(caseDef.texture.size(), CHECKSUM_IMAGE_FORMAT);
	UniquePtr<Buffer>	resultBuffer			(new Buffer(vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT),
												 MemoryRequirement::HostVisible));

	{
		const Allocation& alloc = resultBuffer->getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Descriptors

	Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers));

	std::vector<SharedVkDescriptorSet>	allDescriptorSets;
	std::vector<SharedVkImageView>		allMultisampledImageViews;
	std::vector<SharedVkImageView>		allChecksumImageViews;

	insertDescriptorSets(vk, device, caseDef, *descriptorPool, *descriptorSetLayout, &allDescriptorSets);
	insertImageViews	(vk, device, caseDef, caseDef.format, **msImage, &allMultisampledImageViews);
	insertImageViews	(vk, device, caseDef, CHECKSUM_IMAGE_FORMAT, **checksumImage, &allChecksumImageViews);

	// Prepare commands

	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const tcu::IVec3				workSize				= (caseDef.singleLayerBind ? caseDef.texture.layerSize() : caseDef.texture.size());
	const int						loopNumLayers			= (caseDef.singleLayerBind ? numLayers : 1);
	const VkImageSubresourceRange	subresourceAllLayers	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, caseDef.texture.numLayers());

	// Pass 1: Write MS image
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_store"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **checksumImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Pass 2: "Resolve" MS image in compute shader
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_load"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo		descriptorChecksumImageInfo		= makeDescriptorImageInfo(DE_NULL, **allChecksumImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorChecksumImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Retrieve result
	{
		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **checksumImage, subresourceAllLayers),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(caseDef.texture.layerSize()), caseDef.texture.numLayers());
			vk.cmdCopyImageToBuffer(*cmdBuffer, **checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **resultBuffer, 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **resultBuffer, 0ull, resultBufferSizeBytes),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify
	{
		const Allocation& alloc = resultBuffer->getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);

		const IVec3		imageSize			= caseDef.texture.size();
		const deInt32*	pDataPtr			= static_cast<deInt32*>(alloc.getHostPtr());
		const deInt32	expectedChecksum	= caseDef.texture.numSamples();

		for (int layer = 0; layer < imageSize.z(); ++layer)
		for (int y = 0; y < imageSize.y(); ++y)
		for (int x = 0; x < imageSize.x(); ++x)
		{
			if (*pDataPtr != expectedChecksum)
			{
				context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Some sample colors were incorrect at (x, y, layer) = (" << x << ", " << y << ", " << layer << ")"	<< tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Checksum value is " << *pDataPtr << " but expected " << expectedChecksum << tcu::TestLog::EndMessage;

				return tcu::TestStatus::fail("Some sample colors were incorrect");
			}
			++pDataPtr;
		}

		return tcu::TestStatus::pass("OK");
	}
}